

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O3

bool __thiscall
ReplayInterface::enqueue_create_descriptor_set_layout
          (ReplayInterface *this,Hash hash,VkDescriptorSetLayoutCreateInfo *create_info,
          VkDescriptorSetLayout *layout)

{
  bool bVar1;
  bool bVar2;
  Hash in_RAX;
  Hash recorded_hash;
  Hash local_28;
  
  local_28 = in_RAX;
  bVar1 = Fossilize::Hashing::compute_hash_descriptor_set_layout
                    (&this->recorder,create_info,&local_28);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, local_28 == hash)) {
    *layout = (VkDescriptorSetLayout)hash;
    bVar2 = Fossilize::StateRecorder::record_descriptor_set_layout
                      (&this->recorder,(VkDescriptorSetLayout)hash,create_info,0);
  }
  return bVar2;
}

Assistant:

bool enqueue_create_descriptor_set_layout(Hash hash, const VkDescriptorSetLayoutCreateInfo *create_info, VkDescriptorSetLayout *layout) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_descriptor_set_layout(recorder, *create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*layout = fake_handle<VkDescriptorSetLayout>(hash);
		return recorder.record_descriptor_set_layout(*layout, *create_info);
	}